

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int ecp_precompute_comb(mbedtls_ecp_group *grp,mbedtls_ecp_point *T,mbedtls_ecp_point *P,uchar w,
                       size_t d)

{
  int iVar1;
  mbedtls_ecp_point *pmVar2;
  mbedtls_ecp_point *local_148;
  mbedtls_ecp_point *TT [31];
  mbedtls_ecp_point *cur;
  size_t j;
  uchar k;
  uchar i;
  int ret;
  size_t d_local;
  uchar w_local;
  mbedtls_ecp_point *P_local;
  mbedtls_ecp_point *T_local;
  mbedtls_ecp_group *grp_local;
  
  j._4_4_ = mbedtls_ecp_copy(T,P);
  if (j._4_4_ == 0) {
    j._2_1_ = 0;
    for (j._3_1_ = 1; (uint)j._3_1_ < (uint)(1 << (w - 1 & 0x1f)); j._3_1_ = j._3_1_ << 1) {
      pmVar2 = T + (int)(uint)j._3_1_;
      iVar1 = mbedtls_ecp_copy(pmVar2,T + ((int)(uint)j._3_1_ >> 1));
      if (iVar1 != 0) {
        return iVar1;
      }
      for (cur = (mbedtls_ecp_point *)0x0; cur < d;
          cur = (mbedtls_ecp_point *)((long)&(cur->X).s + 1)) {
        iVar1 = ecp_double_jac(grp,pmVar2,pmVar2);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      TT[(ulong)j._2_1_ - 1] = pmVar2;
      j._2_1_ = j._2_1_ + 1;
    }
    j._4_4_ = ecp_normalize_jac_many(grp,&local_148,(ulong)j._2_1_);
    if (j._4_4_ == 0) {
      j._2_1_ = 0;
      for (j._3_1_ = 1; (uint)j._3_1_ < (uint)(1 << (w - 1 & 0x1f)); j._3_1_ = j._3_1_ << 1) {
        cur = (mbedtls_ecp_point *)(ulong)j._3_1_;
        while (pmVar2 = (mbedtls_ecp_point *)((long)&cur[-1].Z.p + 7),
              cur != (mbedtls_ecp_point *)0x0) {
          iVar1 = ecp_add_mixed(grp,T + (long)((long)&(pmVar2->X).s + (ulong)j._3_1_),
                                T + (long)pmVar2,T + j._3_1_);
          if (iVar1 != 0) {
            return iVar1;
          }
          TT[(ulong)j._2_1_ - 1] = T + (long)((long)&(pmVar2->X).s + (ulong)j._3_1_);
          cur = pmVar2;
          j._2_1_ = j._2_1_ + 1;
        }
      }
      j._4_4_ = ecp_normalize_jac_many(grp,&local_148,(ulong)j._2_1_);
    }
  }
  return j._4_4_;
}

Assistant:

static int ecp_precompute_comb( const mbedtls_ecp_group *grp,
                                mbedtls_ecp_point T[], const mbedtls_ecp_point *P,
                                unsigned char w, size_t d )
{
    int ret;
    unsigned char i, k;
    size_t j;
    mbedtls_ecp_point *cur, *TT[COMB_MAX_PRE - 1];

    /*
     * Set T[0] = P and
     * T[2^{l-1}] = 2^{dl} P for l = 1 .. w-1 (this is not the final value)
     */
    MBEDTLS_MPI_CHK( mbedtls_ecp_copy( &T[0], P ) );

    k = 0;
    for( i = 1; i < ( 1U << ( w - 1 ) ); i <<= 1 )
    {
        cur = T + i;
        MBEDTLS_MPI_CHK( mbedtls_ecp_copy( cur, T + ( i >> 1 ) ) );
        for( j = 0; j < d; j++ )
            MBEDTLS_MPI_CHK( ecp_double_jac( grp, cur, cur ) );

        TT[k++] = cur;
    }

    MBEDTLS_MPI_CHK( ecp_normalize_jac_many( grp, TT, k ) );

    /*
     * Compute the remaining ones using the minimal number of additions
     * Be careful to update T[2^l] only after using it!
     */
    k = 0;
    for( i = 1; i < ( 1U << ( w - 1 ) ); i <<= 1 )
    {
        j = i;
        while( j-- )
        {
            MBEDTLS_MPI_CHK( ecp_add_mixed( grp, &T[i + j], &T[j], &T[i] ) );
            TT[k++] = &T[i + j];
        }
    }

    MBEDTLS_MPI_CHK( ecp_normalize_jac_many( grp, TT, k ) );

cleanup:
    return( ret );
}